

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::StatementBlockSymbol::elaborateVariables
          (StatementBlockSymbol *this,function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  LookupLocation lookupLocation_01;
  bool bVar1;
  undefined1 uVar2;
  iterator ppSVar3;
  Expression *pEVar4;
  PatternSyntax *patternSyntax;
  ExpressionSyntax *condSyntax;
  function_ref<void_(const_slang::ast::Symbol_&)> *this_00;
  iterator ppPVar5;
  Symbol *in_RDI;
  PatternVarSymbol *var_2;
  iterator __end6;
  iterator __begin6;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *__range6;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> vars_2;
  CaseStatementSyntax *caseSyntax;
  ASTContext context_2;
  PatternVarSymbol *var_1;
  iterator __end5;
  iterator __begin5;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *__range5;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> vars_1;
  ConditionalPatternSyntax *cond;
  ASTContext context_1;
  LoopDim *dim;
  iterator __end4;
  iterator __begin4;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *__range4;
  ASTContext context;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  Symbol *var;
  iterator __end3;
  iterator __begin3;
  SmallVector<const_slang::ast::Symbol_*,_5UL> *__range3;
  SmallVector<const_slang::ast::Symbol_*,_5UL> vars;
  SyntaxNode *syntax;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  Scope *in_stack_fffffffffffffca0;
  ASTContext *in_stack_fffffffffffffca8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  Symbol *pSVar6;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  ExpressionSyntax *in_stack_fffffffffffffcc8;
  PatternSyntax *in_stack_fffffffffffffcd0;
  ASTContext *in_stack_fffffffffffffcd8;
  iterator local_2e0;
  SmallVectorBase<const_slang::ast::PatternVarSymbol_*> local_2d0 [2];
  CaseStatementSyntax *local_290;
  bitmask<slang::ast::ASTFlags> local_288;
  undefined8 local_280;
  undefined8 local_278;
  PatternVarSymbol *local_238;
  iterator local_230;
  iterator local_228;
  SmallVectorBase<const_slang::ast::PatternVarSymbol_*> *local_220;
  SmallVectorBase<const_slang::ast::PatternVarSymbol_*> local_218 [2];
  ConditionalPatternSyntax *local_1d8;
  bitmask<slang::ast::ASTFlags> local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  iterator local_180;
  iterator local_178;
  iterator local_170;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *local_168;
  bitmask<slang::ast::ASTFlags> local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *in_stack_ffffffffffffff08;
  ASTContext *in_stack_ffffffffffffff10;
  ForeachLoopListSyntax *in_stack_ffffffffffffff18;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_ffffffffffffff60;
  Scope *in_stack_ffffffffffffff68;
  RsRuleSyntax *in_stack_ffffffffffffff70;
  iterator local_80;
  SmallVectorBase<const_slang::ast::Symbol_*> local_60 [2];
  SyntaxNode *local_20;
  
  local_20 = Symbol::getSyntax(in_RDI);
  if (local_20 != (SyntaxNode *)0x0) {
    if (local_20->kind == RsRule) {
      SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xf73441);
      slang::syntax::SyntaxNode::as<slang::syntax::RsRuleSyntax>(local_20);
      RandSeqProductionSymbol::createRuleVariables
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      local_80 = SmallVectorBase<const_slang::ast::Symbol_*>::begin(local_60);
      ppSVar3 = SmallVectorBase<const_slang::ast::Symbol_*>::end(local_60);
      for (; local_80 != ppSVar3; local_80 = local_80 + 1) {
        function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                  ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffca0,
                   (Symbol *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
      }
      SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0xf73533);
    }
    else if (local_20->kind == ForeachLoopStatement) {
      SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::SmallVector
                ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0xf73559);
      local_158 = LookupLocation::max;
      uStack_150 = DAT_01a3c808;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_160,None);
      lookupLocation._8_7_ = in_stack_fffffffffffffcc0;
      lookupLocation.scope = (Scope *)in_stack_fffffffffffffcb8;
      lookupLocation._15_1_ = in_stack_fffffffffffffcc7;
      ASTContext::ASTContext
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,lookupLocation,
                 in_stack_fffffffffffffcb0);
      slang::syntax::SyntaxNode::as<slang::syntax::ForeachLoopStatementSyntax>(local_20);
      not_null<slang::syntax::ForeachLoopListSyntax_*>::operator*
                ((not_null<slang::syntax::ForeachLoopListSyntax_*> *)0xf735d7);
      pEVar4 = ForeachLoopStatement::buildLoopDims
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
      if (pEVar4 == (Expression *)0x0) {
        in_RDI[2].name._M_str = InvalidStatement::Instance;
      }
      local_168 = (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *)
                  &stack0xfffffffffffffef8;
      local_170 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::begin(local_168);
      local_178 = SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::end(local_168);
      for (; local_170 != local_178; local_170 = local_170 + 1) {
        local_180 = local_170;
        if (local_170->loopVar != (IteratorSymbol *)0x0) {
          function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                    ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffca0,
                     (Symbol *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
        }
      }
      SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL>::~SmallVector
                ((SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> *)0xf736f2);
    }
    else if (local_20->kind == ConditionalPattern) {
      pSVar6 = in_RDI + 1;
      local_1c8 = LookupLocation::max;
      local_1c0 = DAT_01a3c808;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_1d0,None);
      lookupLocation_00._8_7_ = in_stack_fffffffffffffcc0;
      lookupLocation_00.scope = (Scope *)in_stack_fffffffffffffcb8;
      lookupLocation_00._15_1_ = in_stack_fffffffffffffcc7;
      ASTContext::ASTContext
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,lookupLocation_00,
                 in_stack_fffffffffffffcb0);
      local_1d8 = slang::syntax::SyntaxNode::as<slang::syntax::ConditionalPatternSyntax>(local_20);
      SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)0xf73792);
      patternSyntax =
           not_null<slang::syntax::PatternSyntax_*>::operator*
                     ((not_null<slang::syntax::PatternSyntax_*> *)0xf737a7);
      condSyntax = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)0xf737bf);
      bVar1 = Pattern::createPatternVars
                        ((ASTContext *)pSVar6,patternSyntax,condSyntax,
                         (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
                         CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
      if (!bVar1) {
        in_RDI[2].name._M_str = InvalidStatement::Instance;
      }
      local_220 = local_218;
      local_228 = SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::begin(local_220);
      local_230 = SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::end(local_220);
      for (; local_228 != local_230; local_228 = local_228 + 1) {
        local_238 = *local_228;
        function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                  ((function_ref<void_(const_slang::ast::Symbol_&)> *)in_stack_fffffffffffffca0,
                   (Symbol *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
      }
      SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)0xf738cb);
    }
    else if (local_20->kind == PatternCaseItem) {
      pSVar6 = in_RDI + 1;
      local_280 = LookupLocation::max;
      local_278 = DAT_01a3c808;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_288,None);
      lookupLocation_01._8_7_ = in_stack_fffffffffffffcc0;
      lookupLocation_01.scope = (Scope *)pSVar6;
      lookupLocation_01._15_1_ = in_stack_fffffffffffffcc7;
      ASTContext::ASTContext
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,lookupLocation_01,
                 in_stack_fffffffffffffcb0);
      local_290 = slang::syntax::SyntaxNode::as<slang::syntax::CaseStatementSyntax>
                            (local_20->parent);
      SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)0xf73972);
      slang::syntax::SyntaxNode::as<slang::syntax::PatternCaseItemSyntax>(local_20);
      not_null<slang::syntax::PatternSyntax_*>::operator*
                ((not_null<slang::syntax::PatternSyntax_*> *)0xf73994);
      this_00 = (function_ref<void_(const_slang::ast::Symbol_&)> *)
                not_null<slang::syntax::ExpressionSyntax_*>::operator*
                          ((not_null<slang::syntax::ExpressionSyntax_*> *)0xf739af);
      uVar2 = Pattern::createPatternVars
                        (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                         in_stack_fffffffffffffcc8,
                         (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
                         CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0));
      if (!(bool)uVar2) {
        in_RDI[2].name._M_str = InvalidStatement::Instance;
      }
      local_2e0 = SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::begin(local_2d0);
      ppPVar5 = SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::end(local_2d0);
      for (; local_2e0 != ppPVar5; local_2e0 = local_2e0 + 1) {
        function_ref<void_(const_slang::ast::Symbol_&)>::operator()
                  (this_00,(Symbol *)CONCAT17(uVar2,in_stack_fffffffffffffc98));
      }
      SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)0xf73ab5);
    }
  }
  return;
}

Assistant:

void StatementBlockSymbol::elaborateVariables(function_ref<void(const Symbol&)> insertCB) const {
    SLANG_ASSERT(!stmt);

    auto syntax = getSyntax();
    if (!syntax)
        return;

    if (syntax->kind == SyntaxKind::RsRule) {
        // Create variables to hold results from all non-void productions
        // invoked by this rule.
        SmallVector<const Symbol*> vars;
        RandSeqProductionSymbol::createRuleVariables(syntax->as<RsRuleSyntax>(), *this, vars);
        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::ForeachLoopStatement) {
        SmallVector<ForeachLoopStatement::LoopDim, 4> dims;
        ASTContext context(*this, LookupLocation::max);

        if (!ForeachLoopStatement::buildLoopDims(*syntax->as<ForeachLoopStatementSyntax>().loopList,
                                                 context, dims)) {
            // If building loop dims failed we don't want to later proceed with trying to
            // bind the statement again, so just set to invalid here.
            stmt = &InvalidStatement::Instance;
        }

        for (auto& dim : dims) {
            if (dim.loopVar)
                insertCB(*dim.loopVar);
        }
    }
    else if (syntax->kind == SyntaxKind::ConditionalPattern) {
        ASTContext context(*this, LookupLocation::max);

        auto& cond = syntax->as<ConditionalPatternSyntax>();
        SLANG_ASSERT(cond.matchesClause);

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *cond.matchesClause->pattern, *cond.expr, vars))
            stmt = &InvalidStatement::Instance;

        for (auto var : vars)
            insertCB(*var);
    }
    else if (syntax->kind == SyntaxKind::PatternCaseItem) {
        ASTContext context(*this, LookupLocation::max);
        SLANG_ASSERT(syntax->parent);
        auto& caseSyntax = syntax->parent->as<CaseStatementSyntax>();

        SmallVector<const PatternVarSymbol*> vars;
        if (!Pattern::createPatternVars(context, *syntax->as<PatternCaseItemSyntax>().pattern,
                                        *caseSyntax.expr, vars)) {
            stmt = &InvalidStatement::Instance;
        }

        for (auto var : vars)
            insertCB(*var);
    }
}